

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

string * __thiscall
t_rs_generator::rust_upper_case(string *__return_storage_ptr__,t_rs_generator *this,string *name)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference pcVar4;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  string local_88;
  string local_68;
  undefined1 local_42;
  char local_41;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_40;
  char i;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  bool all_uppercase;
  string *name_local;
  t_rs_generator *this_local;
  string *str;
  
  bVar1 = true;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_40._M_current = (char *)std::__cxx11::string::end();
  do {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc0);
    if (!bVar2) {
LAB_00446009:
      if (bVar1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
      }
      else {
        local_42 = 0;
        std::__cxx11::string::string((string *)&local_88,(string *)name);
        t_generator::underscore(&local_68,&this->super_t_generator,&local_88);
        t_generator::uppercase(__return_storage_ptr__,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b8,"__",&local_b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e0,"_",&local_e1);
        string_replace(this,__return_storage_ptr__,&local_b8,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      }
      return __return_storage_ptr__;
    }
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_41 = *pcVar4;
    iVar3 = isalpha((int)local_41);
    if ((iVar3 != 0) && (iVar3 = islower((int)local_41), iVar3 != 0)) {
      bVar1 = false;
      goto LAB_00446009;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

string t_rs_generator::rust_upper_case(const string& name) {
  bool all_uppercase = true;

  for (char i : name) {
    if (isalpha(i) && islower(i)) {
      all_uppercase = false;
      break;
    }
  }

  if (all_uppercase) {
    return name;
  } else {
    string str(uppercase(underscore(name)));
    string_replace(str, "__", "_");
    return str;
  }
}